

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neuron.cpp
# Opt level: O2

void __thiscall
indk::Neuron::doCreateNewSynapse
          (Neuron *this,string *EName,vector<float,_std::allocator<float>_> *PosVector,float k1,
          int64_t Tl,int NT)

{
  uint _Xm;
  pointer ppVar1;
  Entry *this_00;
  __type _Var2;
  Position *this_01;
  Error *this_02;
  pointer __lhs;
  _Vector_base<float,_std::allocator<float>_> local_48;
  
  if ((long)(PosVector->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(PosVector->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
            super__Vector_impl_data._M_start >> 2 != (ulong)this->DimensionsCount) {
    this_02 = (Error *)__cxa_allocate_exception(0x28);
    Error::Error(this_02,10);
    __cxa_throw(this_02,&Error::typeinfo,Error::~Error);
  }
  __lhs = (this->Entries).
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (this->Entries).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (__lhs == ppVar1) {
      return;
    }
    _Var2 = std::operator==(&__lhs->first,EName);
    if (_Var2) break;
    __lhs = __lhs + 1;
  }
  this_00 = __lhs->second;
  this_01 = (Position *)operator_new(0x10);
  _Xm = this->Xm;
  local_48._M_impl.super__Vector_impl_data._M_start =
       (PosVector->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
       super__Vector_impl_data._M_start;
  local_48._M_impl.super__Vector_impl_data._M_finish =
       (PosVector->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage =
       (PosVector->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (PosVector->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (PosVector->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (PosVector->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  Position::Position(this_01,_Xm,(vector<float,_std::allocator<float>_> *)&local_48);
  Entry::doAddSynapse(this_00,this_01,this->Xm,k1,Tl,NT);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_48);
  return;
}

Assistant:

void indk::Neuron::doCreateNewSynapse(const std::string& EName, std::vector<float> PosVector, float k1, int64_t Tl, int NT) {
	if (PosVector.size() != DimensionsCount) {
        throw indk::Error(indk::Error::EX_POSITION_DIMENSIONS);
	}
    for (const auto &e: Entries) {
        if (e.first == EName) {
            e.second -> doAddSynapse(new indk::Position(Xm, std::move(PosVector)), Xm, k1, Tl, NT);
            break;
        }
    }
}